

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

ON_String * __thiscall
ON_ClassArray<ON_String>::SetCapacity(ON_ClassArray<ON_String> *this,size_t new_capacity)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar4 = *(uint *)(this + 0x14);
  uVar5 = (ulong)uVar4;
  if (uVar5 == 0) {
    *(undefined8 *)(this + 8) = 0;
    *(undefined4 *)(this + 0x10) = 0;
  }
  uVar3 = (uint)new_capacity;
  if (0x7ffffffe < new_capacity - 1 >> 1) {
    uVar3 = 0;
  }
  if ((int)uVar3 < 1) {
    if (*(long *)(this + 8) != 0) {
      if (0 < (int)uVar4) {
        lVar2 = uVar5 * 8;
        lVar6 = uVar5 + 1;
        do {
          lVar2 = lVar2 + -8;
          ON_String::~ON_String((ON_String *)(*(long *)(this + 8) + lVar2));
          lVar6 = lVar6 + -1;
        } while (1 < lVar6);
      }
      (**(code **)(*(long *)this + 0x20))(this,*(undefined8 *)(this + 8),0);
      *(undefined8 *)(this + 8) = 0;
    }
  }
  else if ((int)uVar4 < (int)uVar3) {
    lVar2 = (**(code **)(*(long *)this + 0x20))(this,*(undefined8 *)(this + 8),uVar3);
    *(long *)(this + 8) = lVar2;
    if (lVar2 != 0) {
      memset((void *)(lVar2 + (long)*(int *)(this + 0x14) * 8),0,
             ((long)(int)uVar3 - (long)*(int *)(this + 0x14)) * 8);
      iVar1 = *(int *)(this + 0x14);
      if (iVar1 < (int)uVar3) {
        lVar2 = (ulong)uVar3 - (long)iVar1;
        lVar6 = (long)iVar1 << 3;
        do {
          ON_String::ON_String((ON_String *)(*(long *)(this + 8) + lVar6));
          lVar6 = lVar6 + 8;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
      *(uint *)(this + 0x14) = uVar3;
      goto LAB_003b2433;
    }
  }
  else {
    if ((int)uVar4 <= (int)uVar3) goto LAB_003b2433;
    do {
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
      ON_String::~ON_String((ON_String *)(uVar5 * 8 + *(long *)(this + 8)));
    } while ((int)uVar3 < (int)uVar4);
    if ((int)uVar3 < *(int *)(this + 0x10)) {
      *(uint *)(this + 0x10) = uVar3;
    }
    *(uint *)(this + 0x14) = uVar3;
    lVar2 = (**(code **)(*(long *)this + 0x20))(this,*(undefined8 *)(this + 8),uVar3);
    *(long *)(this + 8) = lVar2;
    if (lVar2 != 0) goto LAB_003b2433;
  }
  *(undefined8 *)(this + 0x10) = 0;
LAB_003b2433:
  return *(ON_String **)(this + 8);
}

Assistant:

T* ON_ClassArray<T>::SetCapacity( size_t new_capacity ) 
{
  if (0 == m_capacity)
  {
    // Allow "expert" users of ON_SimpleArray<>.SetArray(*,*,0) to clean up after themselves
    // and deals with the case when the forget to clean up after themselves.
    m_a = nullptr;
    m_count = 0;
  }
  // uses "placement" for class construction/destruction
  int i;
  int capacity = (new_capacity > 0 && new_capacity < ON_UNSET_UINT_INDEX)
               ? (int)new_capacity 
               : 0;

  if ( capacity <= 0 ) {
    if ( m_a ) {
      for ( i = m_capacity-1; i >= 0; i-- ) {
        DestroyElement(m_a[i]);
      }
      Realloc(m_a,0);
      m_a = 0;
    }
    m_count = 0;
    m_capacity = 0;
  }
  else if ( m_capacity < capacity ) {
    // growing
    m_a = Realloc( m_a, capacity );
    // initialize new elements with default constructor
    if ( 0 != m_a )
    {
      // even when m_a is an array of classes with vtable pointers,
      // this call to memset(..., 0, ...) is what I want to do
      // because in-place construction will be used when needed
      // on this memory.
      memset( (void*)(m_a + m_capacity), 0, (capacity-m_capacity)*sizeof(T) );
      for ( i = m_capacity; i < capacity; i++ ) {
        ConstructDefaultElement(&m_a[i]);
      }
      m_capacity = capacity;
    }
    else
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  else if ( m_capacity > capacity ) {
    // shrinking
    for ( i = m_capacity-1; i >= capacity; i-- ) {
      DestroyElement(m_a[i]);
    }
    if ( m_count > capacity )
      m_count = capacity;
    m_capacity = capacity;
    m_a = Realloc( m_a, capacity );
    if ( 0 == m_a )
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  return m_a;
}